

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int testobjref(global_State *g,GCObject *f,GCObject *t)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  bVar1 = t->marked;
  if (((g->currentwhite ^ 0x18) & bVar1) == 0) {
    if ((byte)(g->gcstate - 3) < 4) {
      return 1;
    }
    bVar2 = f->marked;
    if (g->gckind == '\0') {
      if ((bVar1 & 0x18) == 0) {
        return 1;
      }
    }
    else {
      if (((bVar1 & 6) == 0) && ((bVar2 & 0x27) == 0x24)) goto LAB_0014cb16;
      if (((bVar2 & 7) != 6) && ((bVar2 & 7) != 3)) {
        return 1;
      }
      if ((bVar1 & 7) != 0) {
        return 1;
      }
    }
    if ((bVar2 & 0x20) == 0) {
      return 1;
    }
  }
LAB_0014cb16:
  printf("%d(%02X) - ");
  uVar3._0_1_ = g->currentwhite;
  uVar3._1_1_ = g->gcstate;
  uVar3._2_1_ = g->gckind;
  uVar3._3_1_ = g->gcstopem;
  printobj((global_State *)(ulong)uVar3,f);
  printf("  ->  ");
  uVar4._0_1_ = g->currentwhite;
  uVar4._1_1_ = g->gcstate;
  uVar4._2_1_ = g->gckind;
  uVar4._3_1_ = g->gcstopem;
  printobj((global_State *)(ulong)uVar4,t);
  putchar(10);
  return 0;
}

Assistant:

static int testobjref (global_State *g, GCObject *f, GCObject *t) {
  int r1 = testobjref1(g, f, t);
  if (!r1) {
    printf("%d(%02X) - ", g->gcstate, g->currentwhite);
    printobj(g, f);
    printf("  ->  ");
    printobj(g, t);
    printf("\n");
  }
  return r1;
}